

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O3

uint * Abc_NodeSuperChoiceTruth(Abc_ManScl_t *pManScl)

{
  char cVar1;
  int iVar2;
  void **ppvVar3;
  uint **ppuVar4;
  Vec_Ptr_t *pVVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  
  lVar8 = (long)pManScl->vLeaves->nSize;
  if (0 < lVar8) {
    ppvVar3 = pManScl->vLeaves->pArray;
    ppuVar4 = pManScl->uVars;
    lVar10 = 0;
    do {
      *(uint **)((long)ppvVar3[lVar10] + 8) = ppuVar4[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
  }
  pVVar5 = pManScl->vVolume;
  if (pVVar5->nSize < 1) {
    puVar9 = (uint *)0x0;
  }
  else {
    ppvVar3 = pVVar5->pArray;
    ppuVar4 = pManScl->uSims;
    lVar8 = 0;
    do {
      plVar6 = (long *)ppvVar3[lVar8];
      puVar9 = ppuVar4[lVar8];
      plVar6[1] = (long)puVar9;
      lVar10 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
      lVar7 = *(long *)(*(long *)(lVar10 + (long)*(int *)plVar6[4] * 8) + 8);
      lVar10 = *(long *)(*(long *)(lVar10 + (long)((int *)plVar6[4])[1] * 8) + 8);
      cVar1 = ((char *)plVar6[7])[1];
      iVar2 = pManScl->nWords;
      if (*(char *)plVar6[7] == '0') {
        if (cVar1 == '0') {
          if (0 < iVar2) {
            lVar11 = 0;
            do {
              puVar9[lVar11] = ~(*(uint *)(lVar10 + lVar11 * 4) | *(uint *)(lVar7 + lVar11 * 4));
              lVar11 = lVar11 + 1;
            } while (lVar11 < pManScl->nWords);
          }
        }
        else if (0 < iVar2) {
          lVar11 = 0;
          do {
            puVar9[lVar11] = ~*(uint *)(lVar7 + lVar11 * 4) & *(uint *)(lVar10 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (lVar11 < pManScl->nWords);
        }
      }
      else if (cVar1 == '0') {
        if (0 < iVar2) {
          lVar11 = 0;
          do {
            puVar9[lVar11] = ~*(uint *)(lVar10 + lVar11 * 4) & *(uint *)(lVar7 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (lVar11 < pManScl->nWords);
        }
      }
      else if (0 < iVar2) {
        lVar11 = 0;
        do {
          puVar9[lVar11] = *(uint *)(lVar10 + lVar11 * 4) & *(uint *)(lVar7 + lVar11 * 4);
          lVar11 = lVar11 + 1;
        } while (lVar11 < pManScl->nWords);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar5->nSize);
  }
  return puVar9;
}

Assistant:

unsigned * Abc_NodeSuperChoiceTruth( Abc_ManScl_t * pManScl )
{
    Abc_Obj_t * pObj;
    unsigned * puData0, * puData1, * puData = NULL;
    char * pSop;
    int i, k;
    // set elementary truth tables
    Vec_PtrForEachEntry( Abc_Obj_t *, pManScl->vLeaves, pObj, i )
        pObj->pNext = (Abc_Obj_t *)pManScl->uVars[i];
    // compute truth tables for internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, pManScl->vVolume, pObj, i )
    {
        // set storage for the node's simulation info
        pObj->pNext = (Abc_Obj_t *)pManScl->uSims[i];
        // get pointer to the simulation info
        puData  = (unsigned *)pObj->pNext;
        puData0 = (unsigned *)Abc_ObjFanin0(pObj)->pNext;
        puData1 = (unsigned *)Abc_ObjFanin1(pObj)->pNext;
        // simulate
        pSop = (char *)pObj->pData;
        if ( pSop[0] == '0' && pSop[1] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = ~puData0[k] & ~puData1[k];
        else if ( pSop[0] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = ~puData0[k] & puData1[k];
        else if ( pSop[1] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = puData0[k] & ~puData1[k];
        else 
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = puData0[k] & puData1[k];
    }
    return puData;
}